

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcBlast.c
# Opt level: O2

void Wlc_BlastMinus(Gia_Man_t *pNew,int *pNum,int nNum,Vec_Int_t *vRes)

{
  int iVar1;
  int iCtrl;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  
  piVar2 = Wlc_VecCopy(vRes,pNum,nNum);
  uVar4 = 0;
  uVar3 = (ulong)(uint)nNum;
  if (nNum < 1) {
    uVar3 = uVar4;
  }
  iCtrl = 0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    iVar1 = Abc_LitNot(piVar2[uVar4]);
    iVar1 = Gia_ManHashMux(pNew,iCtrl,iVar1,piVar2[uVar4]);
    piVar2[uVar4] = iVar1;
    iCtrl = Gia_ManHashOr(pNew,iCtrl,pNum[uVar4]);
  }
  return;
}

Assistant:

void Wlc_BlastMinus( Gia_Man_t * pNew, int * pNum, int nNum, Vec_Int_t * vRes )
{
    int * pRes  = Wlc_VecCopy( vRes, pNum, nNum );
    int i, invert = 0;
    for ( i = 0; i < nNum; i++ )
    {
        pRes[i] = Gia_ManHashMux( pNew, invert, Abc_LitNot(pRes[i]), pRes[i] );
        invert = Gia_ManHashOr( pNew, invert, pNum[i] );    
    }
}